

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cubeb-test.cpp
# Opt level: O2

uint32_t __thiscall cubeb_client::get_stream_output_latency(cubeb_client *this)

{
  uint in_EAX;
  int iVar1;
  ulong uStack_8;
  uint32_t latency;
  
  uStack_8 = (ulong)in_EAX;
  iVar1 = cubeb_stream_get_latency(this->stream,&latency);
  if (iVar1 == 0) {
  }
  else {
    fwrite("Could not get the latency of the stream\n",0x28,1,_stderr);
    latency = 0;
  }
  return latency;
}

Assistant:

uint32_t cubeb_client::get_stream_output_latency() const {
  uint32_t latency = 0;
  int rv = cubeb_stream_get_latency(stream, &latency);
  if (rv != CUBEB_OK) {
    fprintf(stderr, "Could not get the latency of the stream\n");
    return 0;
  }
  return latency;
}